

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_edit_string_zero_terminated
                   (nk_context *ctx,nk_flags flags,char *buffer,int max,nk_plugin_filter filter)

{
  nk_flags nVar1;
  int local_4c;
  int local_48;
  int local_44;
  int local_38 [2];
  int len;
  nk_flags result;
  nk_plugin_filter filter_local;
  char *pcStack_20;
  int max_local;
  char *buffer_local;
  nk_context *pnStack_10;
  nk_flags flags_local;
  nk_context *ctx_local;
  
  _len = filter;
  filter_local._4_4_ = max;
  pcStack_20 = buffer;
  buffer_local._4_4_ = flags;
  pnStack_10 = ctx;
  local_38[0] = nk_strlen(buffer);
  nVar1 = nk_edit_string(pnStack_10,buffer_local._4_4_,pcStack_20,local_38,filter_local._4_4_,_len);
  if (filter_local._4_4_ + -1 < 0) {
    local_44 = 0;
  }
  else {
    local_44 = filter_local._4_4_ + -1;
  }
  if (local_44 < local_38[0]) {
    if (filter_local._4_4_ + -1 < 0) {
      local_48 = 0;
    }
    else {
      local_48 = filter_local._4_4_ + -1;
    }
    local_4c = local_48;
  }
  else {
    local_4c = local_38[0];
  }
  pcStack_20[local_4c] = '\0';
  return nVar1;
}

Assistant:

NK_API nk_flags
nk_edit_string_zero_terminated(struct nk_context *ctx, nk_flags flags,
    char *buffer, int max, nk_plugin_filter filter)
{
    nk_flags result;
    int len = nk_strlen(buffer);
    result = nk_edit_string(ctx, flags, buffer, &len, max, filter);
    buffer[NK_MIN(NK_MAX(max-1,0), len)] = '\0';
    return result;
}